

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O0

void __thiscall ipx::ForrestTomlin::SolvePermuted(ForrestTomlin *this,Vector *lhs,char trans)

{
  size_type sVar1;
  reference pvVar2;
  double *pdVar3;
  Int j;
  char in_DL;
  valarray<double> *in_RSI;
  long in_RDI;
  double dVar4;
  double dVar5;
  int in_stack_00000034;
  char *in_stack_00000038;
  char in_stack_00000047;
  Vector *in_stack_00000048;
  SparseMatrix *in_stack_00000050;
  Int k_3;
  Int k_2;
  Int k_1;
  Int k;
  Int num_updates;
  Vector *in_stack_ffffffffffffff88;
  valarray<double> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar6;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x220));
  local_20 = (int)sVar1;
  if ((in_DL == 't') || (in_DL == 'T')) {
    for (local_1c = 0; local_1c < local_20; local_1c = local_1c + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x220),(long)local_1c);
      pdVar3 = std::valarray<double>::operator[](in_RSI,(long)*pvVar2);
      dVar5 = *pdVar3;
      pdVar3 = std::valarray<double>::operator[](in_RSI,(long)(*(int *)(in_RDI + 0x18) + local_1c));
      *pdVar3 = dVar5;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x220),(long)local_1c);
      pdVar3 = std::valarray<double>::operator[](in_RSI,(long)*pvVar2);
      *pdVar3 = 0.0;
    }
    TriangularSolve(in_stack_00000050,in_stack_00000048,in_stack_00000047,in_stack_00000038,
                    in_stack_00000034);
    while (local_20 = local_20 + -1, -1 < local_20) {
      j = (Int)((ulong)(in_RDI + 0x1a0) >> 0x20);
      iVar6 = local_20;
      std::valarray<double>::operator[](in_RSI,(long)(*(int *)(in_RDI + 0x18) + local_20));
      ScatterColumn((SparseMatrix *)CONCAT44(iVar6,in_stack_ffffffffffffffa0),j,
                    (double)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      pdVar3 = std::valarray<double>::operator[](in_RSI,(long)(*(int *)(in_RDI + 0x18) + local_20));
      dVar5 = *pdVar3;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x220),(long)local_20);
      pdVar3 = std::valarray<double>::operator[](in_RSI,(long)*pvVar2);
      *pdVar3 = dVar5;
      pdVar3 = std::valarray<double>::operator[](in_RSI,(long)(*(int *)(in_RDI + 0x18) + local_20));
      *pdVar3 = 0.0;
    }
    TriangularSolve(in_stack_00000050,in_stack_00000048,in_stack_00000047,in_stack_00000038,
                    in_stack_00000034);
  }
  else {
    TriangularSolve(in_stack_00000050,in_stack_00000048,in_stack_00000047,in_stack_00000038,
                    in_stack_00000034);
    for (local_24 = 0; local_24 < local_20; local_24 = local_24 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x220),(long)local_24);
      pdVar3 = std::valarray<double>::operator[](in_RSI,(long)*pvVar2);
      dVar5 = *pdVar3;
      dVar4 = DotColumn((SparseMatrix *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        (Int)((ulong)in_stack_ffffffffffffff98 >> 0x20),in_stack_ffffffffffffff90);
      dVar5 = dVar5 - dVar4;
      pdVar3 = std::valarray<double>::operator[](in_RSI,(long)(*(int *)(in_RDI + 0x18) + local_24));
      *pdVar3 = dVar5;
      in_stack_ffffffffffffff90 = in_RSI;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x220),(long)local_24);
      pdVar3 = std::valarray<double>::operator[](in_stack_ffffffffffffff90,(long)*pvVar2);
      *pdVar3 = 0.0;
    }
    TriangularSolve(in_stack_00000050,in_stack_00000048,in_stack_00000047,in_stack_00000038,
                    in_stack_00000034);
    while (local_28 = local_20 + -1, -1 < local_28) {
      pdVar3 = std::valarray<double>::operator[](in_RSI,(long)(*(int *)(in_RDI + 0x18) + local_28));
      dVar5 = *pdVar3;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x220),(long)local_28);
      pdVar3 = std::valarray<double>::operator[](in_RSI,(long)*pvVar2);
      *pdVar3 = dVar5;
      pdVar3 = std::valarray<double>::operator[](in_RSI,(long)(*(int *)(in_RDI + 0x18) + local_28));
      *pdVar3 = 0.0;
      local_20 = local_28;
    }
  }
  return;
}

Assistant:

void ForrestTomlin::SolvePermuted(Vector& lhs, char trans) {
    Int num_updates = replaced_.size();
    assert(U_.cols() == dim_+num_updates);

    // Require num_updates elements workspace at end of lhs.
    assert((Int)lhs.size() >= dim_+num_updates);

    if (trans == 't' || trans == 'T') {
        // Move replaced entries to the end of the pivot sequence and zero out
        // their old position. Because the corresponding columns of U are unit
        // columns now, the replaced positions remain zero when solving with U'.
        // This is crucial because we neglected to zero out the corresponding
        // rows of U in the update, so there are entries in U which actually
        // should not be there.
        for (Int k = 0; k < num_updates; k++) {
            lhs[dim_+k] = lhs[replaced_[k]];
            lhs[replaced_[k]] = 0.0;
        }
        TriangularSolve(U_, lhs, 't', "upper", 0);
        // Solve backwards with row eta matrices (leading scatter operations)
        // and put the entry from the end of the pivot sequence back into the
        // position that its update replaced.
        for (Int k = num_updates-1; k >= 0; k--) {
            ScatterColumn(R_, k, -lhs[dim_+k], lhs);
            lhs[replaced_[k]] = lhs[dim_+k];
            lhs[dim_+k] = 0.0;
        }
        TriangularSolve(L_, lhs, 't', "lower", 1);
    }
    else {
        TriangularSolve(L_, lhs, 'n', "lower", 1);
        // Solve forward with row eta matrices (leading gather operations) and
        // put the newly computed entry at the end of the pivot sequence. We
        // actually would not need to zero out the replaced positions here
        // because they will not be accessed by any subsequent eta matrix.
        for (Int k = 0; k < num_updates; k++) {
            lhs[dim_+k] = lhs[replaced_[k]] - DotColumn(R_, k, lhs);
            lhs[replaced_[k]] = 0.0;
        }
        // The triangular solve with U fills the replaced position with garbage.
        // This does not hurt because by the fact that the corresponding columns
        // of U have no nonzero off-diagonal entries, the computed values are
        // not propagated further. We finally overwrite them with their actual
        // values from the end of the pivot sequence.
        TriangularSolve(U_, lhs, 'n', "upper", 0);
        for (Int k = num_updates-1; k >= 0; k--) {
            lhs[replaced_[k]] = lhs[dim_+k];
            lhs[dim_+k] = 0.0;
        }
    }
}